

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O3

void binbuf_text(_binbuf *x,char *text,size_t size)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  t_atom *ptVar4;
  ulong uVar5;
  t_symbol *ptVar6;
  byte bVar7;
  uint newsize;
  long lVar8;
  uint uVar9;
  byte *pbVar10;
  ulong uVar11;
  long lVar12;
  byte bVar13;
  uint uVar14;
  byte *pbVar15;
  bool bVar16;
  double dVar17;
  char buf [1001];
  byte local_428 [1016];
  
  ptVar4 = (t_atom *)resizebytes(x->b_vec,(long)x->b_n << 4,0);
  x->b_vec = ptVar4;
  x->b_n = 0;
  ptVar4 = (t_atom *)resizebytes(ptVar4,0,0x100);
  if (ptVar4 != (t_atom *)0x0) {
    pbVar15 = (byte *)(text + size);
    x->b_vec = ptVar4;
    x->b_n = 0x10;
    newsize = 0x10;
    uVar11 = 0;
LAB_00167c32:
    do {
      if ((byte *)text == pbVar15) break;
      uVar5 = (ulong)(byte)*text;
      if (uVar5 < 0x3c) {
        if ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0) {
          text = (char *)((byte *)text + 1);
          goto LAB_00167c32;
        }
        if (uVar5 == 0x2c) {
          ptVar4->a_type = A_COMMA;
        }
        else {
          if (uVar5 != 0x3b) goto LAB_00167c6d;
          ptVar4->a_type = A_SEMI;
        }
        (ptVar4->a_w).w_float = 0.0;
        text = (char *)((byte *)text + 1);
      }
      else {
LAB_00167c6d:
        uVar9 = 0;
        bVar16 = false;
        lVar8 = 0;
        do {
          bVar2 = false;
          pbVar10 = (byte *)text;
          do {
            text = (char *)(pbVar10 + 1);
            bVar7 = *pbVar10;
            local_428[lVar8] = bVar7;
            if ((int)uVar9 < 0) goto LAB_00167dbd;
            bVar13 = bVar7 - 0x30;
            if (7 < uVar9) {
              uVar14 = 0xffffffff;
              if (bVar13 < 10) {
                uVar14 = uVar9;
              }
              if (uVar9 == 8) {
                uVar9 = uVar14;
              }
              goto LAB_00167dbd;
            }
            switch(uVar9) {
            case 0:
              uVar9 = 1;
              if (bVar7 != 0x2d) goto switchD_00167cbf_caseD_1;
              goto LAB_00167dda;
            case 1:
switchD_00167cbf_caseD_1:
              uVar9 = (uint)(bVar7 == 0x2e) * 4 - 1;
              if (bVar13 < 10) {
                uVar9 = 2;
              }
              break;
            case 2:
              if ((bVar7 - 0x2e < 0x38) &&
                 ((0x80000000800001U >> ((ulong)(bVar7 - 0x2e) & 0x3f) & 1) != 0)) {
                uVar9 = (uint)(bVar7 != 0x2e) * 2 + 4;
                goto LAB_00167dda;
              }
              uVar9 = (bVar13 < 10) - 1 | 2;
              break;
            case 3:
              uVar9 = (bVar13 < 10) - 1 | 5;
              break;
            case 4:
              uVar9 = -(uint)((bVar7 & 0xdf) != 0x45) | 6;
              if (bVar13 < 10) {
                uVar9 = 5;
              }
              break;
            case 5:
              uVar9 = (bVar13 < 10) - 1 | 5;
              if ((bVar7 & 0xdf) == 0x45) {
                uVar9 = 6;
              }
              break;
            case 6:
              uVar9 = 7;
              if ((bVar7 == 0x2b) || (bVar7 == 0x2d)) goto LAB_00167dda;
            case 7:
              uVar9 = (bVar13 < 10) - 1 | 8;
            }
LAB_00167dbd:
            if ((!(bool)(bVar7 != 0x24 | bVar2)) && ((byte *)text != pbVar15)) {
              if ((byte)(*text - 0x30U) < 10) {
                bVar16 = true;
              }
              bVar1 = false;
LAB_00167e54:
              pbVar10 = local_428 + lVar8 + 1;
              if ((bVar1) || (lVar8 == 999)) goto LAB_00167eae;
              goto LAB_00167e6d;
            }
LAB_00167dda:
            bVar1 = (byte *)text == pbVar15;
            if (bVar7 != 0x5c) goto LAB_00167e54;
            lVar12 = lVar8;
            if (bVar2) {
              lVar12 = lVar8 + 1;
            }
            if (bVar1 || lVar12 == 1000) {
              pbVar10 = local_428 + lVar12;
              goto LAB_00167eae;
            }
            bVar1 = !bVar2;
            bVar2 = true;
            pbVar10 = (byte *)text;
          } while (bVar1);
          pbVar10 = local_428 + lVar8 + 1;
LAB_00167e6d:
          lVar8 = lVar8 + 1;
        } while ((0x3b < (ulong)(byte)*text) ||
                ((0x800100100002600U >> ((ulong)(byte)*text & 0x3f) & 1) == 0));
LAB_00167eae:
        *pbVar10 = 0;
        if ((uVar9 < 9) && ((0x134U >> (uVar9 & 0x1f) & 1) != 0)) {
          ptVar4->a_type = A_FLOAT;
          dVar17 = atof((char *)local_428);
          (ptVar4->a_w).w_float = (float)dVar17;
        }
        else if (bVar16) {
          bVar16 = local_428[0] == 0x24;
          if (local_428[1] != 0) {
            pbVar10 = local_428 + 2;
            bVar7 = local_428[1];
            do {
              if ((byte)(bVar7 - 0x3a) < 0xf6) {
                bVar16 = false;
              }
              bVar7 = *pbVar10;
              pbVar10 = pbVar10 + 1;
            } while (bVar7 != 0);
          }
          if (bVar16) {
            ptVar4->a_type = A_DOLLAR;
            iVar3 = atoi((char *)(local_428 + 1));
            (ptVar4->a_w).w_index = iVar3;
          }
          else {
            ptVar4->a_type = A_DOLLSYM;
            ptVar6 = gensym((char *)local_428);
            (ptVar4->a_w).w_symbol = ptVar6;
          }
        }
        else {
          ptVar4->a_type = A_SYMBOL;
          ptVar6 = gensym((char *)local_428);
          (ptVar4->a_w).w_symbol = ptVar6;
        }
      }
      uVar11 = uVar11 + 1;
      if (uVar11 == newsize) {
        newsize = newsize * 2;
        iVar3 = binbuf_resize(x,newsize);
        if (iVar3 == 0) break;
        ptVar4 = x->b_vec + uVar11;
      }
      else {
        ptVar4 = ptVar4 + 1;
      }
    } while ((byte *)text != pbVar15);
    binbuf_resize(x,(int)uVar11);
  }
  return;
}

Assistant:

void binbuf_text(t_binbuf *x, const char *text, size_t size)
{
    char buf[MAXPDSTRING+1], *bufp, *ebuf = buf+MAXPDSTRING;
    const char *textp = text, *etext = text+size;
    t_atom *ap;
    int nalloc = 16, natom = 0;
    binbuf_clear(x);
    if (!binbuf_resize(x, nalloc)) return;
    ap = x->b_vec;
    while (1)
    {
        int type;
            /* skip leading space */
        while ((textp != etext) && (*textp == ' ' || *textp == '\n'
            || *textp == '\r' || *textp == '\t')) textp++;
        if (textp == etext) break;
        if (*textp == ';') SETSEMI(ap), textp++;
        else if (*textp == ',') SETCOMMA(ap), textp++;
        else
        {
                /* it's an atom other than a comma or semi */
            char c;
            int floatstate = 0, slash = 0, lastslash = 0, dollar = 0;
            bufp = buf;
            do
            {
                c = *bufp = *textp++;
                lastslash = slash;
                slash = (c == '\\');

                if (floatstate >= 0)
                {
                    int digit = (c >= '0' && c <= '9'),
                        dot = (c == '.'), minus = (c == '-'),
                        plusminus = (minus || (c == '+')),
                        expon = (c == 'e' || c == 'E');
                    if (floatstate == 0)    /* beginning */
                    {
                        if (minus) floatstate = 1;
                        else if (digit) floatstate = 2;
                        else if (dot) floatstate = 3;
                        else floatstate = -1;
                    }
                    else if (floatstate == 1)   /* got minus */
                    {
                        if (digit) floatstate = 2;
                        else if (dot) floatstate = 3;
                        else floatstate = -1;
                    }
                    else if (floatstate == 2)   /* got digits */
                    {
                        if (dot) floatstate = 4;
                        else if (expon) floatstate = 6;
                        else if (!digit) floatstate = -1;
                    }
                    else if (floatstate == 3)   /* got '.' without digits */
                    {
                        if (digit) floatstate = 5;
                        else floatstate = -1;
                    }
                    else if (floatstate == 4)   /* got '.' after digits */
                    {
                        if (digit) floatstate = 5;
                        else if (expon) floatstate = 6;
                        else floatstate = -1;
                    }
                    else if (floatstate == 5)   /* got digits after . */
                    {
                        if (expon) floatstate = 6;
                        else if (!digit) floatstate = -1;
                    }
                    else if (floatstate == 6)   /* got 'e' */
                    {
                        if (plusminus) floatstate = 7;
                        else if (digit) floatstate = 8;
                        else floatstate = -1;
                    }
                    else if (floatstate == 7)   /* got plus or minus */
                    {
                        if (digit) floatstate = 8;
                        else floatstate = -1;
                    }
                    else if (floatstate == 8)   /* got digits */
                    {
                        if (!digit) floatstate = -1;
                    }
                }
                if (!lastslash && c == '$' && (textp != etext &&
                    textp[0] >= '0' && textp[0] <= '9'))
                        dollar = 1;
                if (!slash) bufp++;
                else if (lastslash)
                {
                    bufp++;
                    slash = 0;
                }
            }
            while (textp != etext && bufp != ebuf &&
                (slash || (*textp != ' ' && *textp != '\n' && *textp != '\r'
                    && *textp != '\t' &&*textp != ',' && *textp != ';')));
            *bufp = 0;
#if 0
            post("binbuf_text: buf %s", buf);
#endif
            if (floatstate == 2 || floatstate == 4 || floatstate == 5 ||
                floatstate == 8)
                    SETFLOAT(ap, atof(buf));
                /* LATER try to figure out how to mix "$" and "\$" correctly;
                here, the backslashes were already stripped so we assume all
                "$" chars are real dollars.  In fact, we only know at least one
                was. */
            else if (dollar)
            {
                if (buf[0] != '$')
                    dollar = 0;
                for (bufp = buf+1; *bufp; bufp++)
                    if (*bufp < '0' || *bufp > '9')
                        dollar = 0;
                if (dollar)
                    SETDOLLAR(ap, atoi(buf+1));
                else SETDOLLSYM(ap, gensym(buf));
            }
            else SETSYMBOL(ap, gensym(buf));
        }
        ap++;
        natom++;
        if (natom == nalloc)
        {
            if (!binbuf_resize(x, nalloc*2)) break;
            nalloc = nalloc * 2;
            ap = x->b_vec + natom;
        }
        if (textp == etext) break;
    }
    /* reallocate the vector to exactly the right size */
    binbuf_resize(x, natom);
}